

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSTree.hpp
# Opt level: O2

void __thiscall BSTree<int>::print(BSTree<int> *this,BSTNode<int> *tree,int key,int direction)

{
  ostream *poVar1;
  char *pcVar2;
  
  for (; tree != (BSTNode<int> *)0x0; tree = tree->right) {
    *(undefined8 *)(memmove + *(long *)(std::cout + -0x18)) = 2;
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,tree->key);
    if (direction == 0) {
      pcVar2 = " is root";
    }
    else {
      poVar1 = std::operator<<(poVar1," is ");
      *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,key);
      poVar1 = std::operator<<(poVar1,"\'s ");
      *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xc;
      pcVar2 = "left child";
      if (direction == 1) {
        pcVar2 = "right child";
      }
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
    print(this,tree->left,tree->key,-1);
    key = tree->key;
    direction = 1;
  }
  return;
}

Assistant:

void BSTree<T>::print(BSTNode<T>* tree, T key, int direction)
{
	if (tree != nullptr) {
		if (direction == 0) {
			std::cout << std::setw(2) << tree->key << " is root" << std::endl;

		} else {
			std::cout << std::setw(2) << tree->key << " is " << std::setw(2)
			<< key << "'s " << std::setw(12) << (direction == 1 ? "right child" : "left child") << std::endl;
		}

		print(tree->left, tree->key, -1);
		print(tree->right, tree->key, 1);
	}
}